

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O0

uint32_t pull_le32(uchar **cursor,size_t *max)

{
  uint32_t uVar1;
  leint32_t local_1c;
  size_t *psStack_18;
  leint32_t lev;
  size_t *max_local;
  uchar **cursor_local;
  
  psStack_18 = max;
  max_local = (size_t *)cursor;
  pull_bytes(&local_1c,4,cursor,max);
  uVar1 = le32_to_cpu(local_1c);
  return uVar1;
}

Assistant:

uint32_t pull_le32(const unsigned char **cursor, size_t *max)
{
    leint32_t lev;
    pull_bytes(&lev, sizeof(lev), cursor, max);
    return le32_to_cpu(lev);
}